

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall
SummizerTestGlobal1_ExceptionOnCallWithoutExpect_Test::TestBody
          (SummizerTestGlobal1_ExceptionOnCallWithoutExpect_Test *this)

{
  bool bVar1;
  AssertHelper local_38;
  Message local_30 [3];
  byte local_11;
  SummizerTestGlobal1_ExceptionOnCallWithoutExpect_Test *pSStack_10;
  bool gtest_caught_any;
  SummizerTestGlobal1_ExceptionOnCallWithoutExpect_Test *this_local;
  
  pSStack_10 = this;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    local_11 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      sum1(0);
    }
    if ((local_11 & 1) != 0) {
      return;
    }
  }
  testing::Message::Message(local_30);
  testing::internal::AssertHelper::AssertHelper
            (&local_38,kFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/apriorit[P]gmock-global/sample/main.cpp"
             ,0xae,"Expected: sum1(0) throws an exception.\n  Actual: it doesn\'t.");
  testing::internal::AssertHelper::operator=(&local_38,local_30);
  testing::internal::AssertHelper::~AssertHelper(&local_38);
  testing::Message::~Message(local_30);
  return;
}

Assistant:

TEST(SummizerTestGlobal1, ExceptionOnCallWithoutExpect)
{
    ASSERT_ANY_THROW(sum1(0));
}